

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O1

void __thiscall logger::OutputWorker::Log(OutputWorker *this,QueuedMessage *message)

{
  char *__s;
  ostream *poVar1;
  size_t sVar2;
  string fmtstr;
  ostringstream ss;
  char local_1b8;
  undefined7 uStack_1b7;
  size_t local_1b0;
  undefined1 local_1a8 [16];
  long local_198 [14];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  local_1b8 = '{';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,&local_1b8,1);
  local_1b8 = *(char *)((long)&kLevelChars + (long)(int)message->LogLevel);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_1b8,1);
  local_1b8 = '-';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_1b8,1);
  __s = message->ChannelName;
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"} ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(message->Message)._M_dataplus._M_p,(message->Message)._M_string_length);
  std::ios::widen((char)(ostringstream *)local_198 + (char)*(undefined8 *)(local_198[0] + -0x18));
  std::ostream::put((char)local_198);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  fwrite((void *)CONCAT71(uStack_1b7,local_1b8),1,local_1b0,_stdout);
  if ((undefined1 *)CONCAT71(uStack_1b7,local_1b8) != local_1a8) {
    operator_delete((undefined1 *)CONCAT71(uStack_1b7,local_1b8));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void OutputWorker::Log(QueuedMessage& message)
{
    std::ostringstream ss;
    ss << '{' << LevelToChar(message.LogLevel) << '-' << message.ChannelName << "} " << message.Message;

#if defined(ANDROID)
    std::string fmtstr = ss.str();
    __android_log_print(ANDROID_LOG_ERROR, LOG_TAG, "%s", fmtstr.c_str());
#else // ANDROID
    ss << std::endl;
    std::string fmtstr = ss.str();
    fwrite(fmtstr.c_str(), 1, fmtstr.size(), stdout);
#endif // ANDROID
}